

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  Mem *pMVar4;
  Mem *in_RSI;
  long *in_RDI;
  int nOut_1;
  u8 enc;
  int nOut;
  char *zStart;
  char zBase [100];
  Mem utf8;
  StrAccum out;
  Mem *pVar;
  int i;
  int nToken;
  int n;
  int nextIndex;
  int idx;
  sqlite3 *db;
  Mem *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  uint uVar5;
  uint in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  char local_f8 [8];
  _func_void_void_ptr *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  Mem *in_stack_ffffffffffffff28;
  uint local_90 [10];
  long local_68;
  u8 local_3c;
  uint *local_38;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  Mem *local_10;
  
  local_1c = 0;
  local_20 = 1;
  lVar1 = *in_RDI;
  sqlite3StrAccumInit((StrAccum *)&stack0xffffffffffffffa8,(sqlite3 *)0x0,local_f8,100,
                      *(int *)(lVar1 + 0x7c));
  local_10 = in_RSI;
  if (*(int *)(lVar1 + 0xc4) < 2) {
    if ((short)in_RDI[4] == 0) {
      sqlite3Strlen30((char *)in_RSI);
      sqlite3_str_append((sqlite3_str *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (char *)in_RSI,0);
      in_stack_fffffffffffffee8 = in_RSI;
    }
    else {
      while (*(char *)&local_10->u != '\0') {
        iVar2 = findNextHostParameter
                          (in_stack_ffffffffffffff00,
                           (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        sqlite3_str_append((sqlite3_str *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (char *)in_stack_fffffffffffffee8,0);
        pcVar3 = (char *)((long)&local_10->u + (long)iVar2);
        if (local_28 == 0) break;
        if (*pcVar3 == '?') {
          if (local_28 < 2) {
            local_1c = local_20;
          }
          else {
            sqlite3GetInt32((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (int *)in_stack_ffffffffffffff10);
          }
        }
        else {
          local_1c = sqlite3VdbeParameterIndex
                               ((Vdbe *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ),(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        }
        local_10 = (Mem *)(pcVar3 + local_28);
        local_20 = local_1c + 1;
        local_38 = (uint *)(in_RDI[0x14] + (long)(local_1c + -1) * 0x38);
        if ((local_38[2] & 1) == 0) {
          if ((local_38[2] & 4) == 0) {
            if ((local_38[2] & 8) == 0) {
              if ((local_38[2] & 2) == 0) {
                if ((local_38[2] & 0x4000) == 0) {
                  sqlite3_str_append((sqlite3_str *)
                                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                     (char *)in_stack_fffffffffffffee8,0);
                  in_stack_fffffffffffffef4 = local_38[3];
                  for (local_2c = 0; local_2c < (int)in_stack_fffffffffffffef4;
                      local_2c = local_2c + 1) {
                    sqlite3_str_appendf((StrAccum *)&stack0xffffffffffffffa8,"%02x",
                                        (ulong)*(byte *)(*(long *)(local_38 + 4) + (long)local_2c));
                  }
                  sqlite3_str_append((sqlite3_str *)
                                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                     (char *)in_stack_fffffffffffffee8,0);
                }
                else {
                  sqlite3_str_appendf((StrAccum *)&stack0xffffffffffffffa8,"zeroblob(%d)",
                                      (ulong)*local_38);
                }
              }
              else {
                in_stack_fffffffffffffef8 =
                     CONCAT13(*(char *)(lVar1 + 0x5e),(int3)in_stack_fffffffffffffef8);
                if (*(char *)(lVar1 + 0x5e) != '\x01') {
                  memset(local_90,0,0x38);
                  local_68 = lVar1;
                  sqlite3VdbeMemSetStr
                            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff1c,(u8)((uint)in_stack_ffffffffffffff18 >> 0x18)
                             ,in_stack_ffffffffffffff10);
                  iVar2 = sqlite3VdbeChangeEncoding(in_stack_fffffffffffffee8,0);
                  if (iVar2 == 7) {
                    local_3c = '\a';
                  }
                  local_38 = local_90;
                }
                in_stack_fffffffffffffefc = local_38[3];
                sqlite3_str_appendf((StrAccum *)&stack0xffffffffffffffa8,"\'%.*q\'",
                                    (ulong)in_stack_fffffffffffffefc,*(undefined8 *)(local_38 + 4));
                if ((char)((uint)in_stack_fffffffffffffef8 >> 0x18) != '\x01') {
                  sqlite3VdbeMemRelease((Mem *)0x1374cd);
                }
              }
            }
            else {
              sqlite3_str_appendf(*(StrAccum **)local_38,&stack0xffffffffffffffa8,"%!.15g");
            }
          }
          else {
            sqlite3_str_appendf((StrAccum *)&stack0xffffffffffffffa8,"%lld",*(undefined8 *)local_38)
            ;
          }
        }
        else {
          sqlite3_str_append((sqlite3_str *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (char *)in_stack_fffffffffffffee8,0);
        }
      }
    }
  }
  else {
    while (uVar5 = in_stack_fffffffffffffef0, *(char *)&local_10->u != '\0') {
      do {
        pMVar4 = (Mem *)((long)&local_10->u + 1);
        in_stack_fffffffffffffef0 = uVar5 & 0xffffff;
        if (*(char *)&local_10->u != '\n') {
          in_stack_fffffffffffffef0 = CONCAT13(*(char *)&pMVar4->u != '\0',(int3)uVar5);
        }
        uVar5 = in_stack_fffffffffffffef0;
        local_10 = pMVar4;
      } while ((char)(in_stack_fffffffffffffef0 >> 0x18) != '\0');
      sqlite3_str_append((sqlite3_str *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (char *)in_stack_fffffffffffffee8,0);
      sqlite3_str_append((sqlite3_str *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (char *)in_stack_fffffffffffffee8,0);
    }
  }
  if (local_3c != '\0') {
    sqlite3_str_reset((StrAccum *)0x1375d5);
  }
  pcVar3 = sqlite3StrAccumFinish((StrAccum *)in_stack_fffffffffffffee8);
  return pcVar3;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, 0, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}